

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

unique_ptr<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>_> __thiscall
bloaty::Bloaty::GetObjectFile(Bloaty *this,string *filename)

{
  InputFileFactory *pIVar1;
  char *__s;
  InputFileFactory *pIVar2;
  undefined8 *in_RDX;
  pointer *__ptr;
  Arg *in_R8;
  string_view format;
  _Head_base<0UL,_bloaty::InputFile_*,_false> local_70;
  InputFileFactory *local_68;
  char *local_60;
  string local_38;
  
  (**(code **)(*(long *)(filename->_M_dataplus)._M_p + 0x10))(&local_70);
  TryOpenELFFile((bloaty *)this,
                 (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)&local_70
                );
  if (this->file_factory_ == (InputFileFactory *)0x0) {
    TryOpenMachOFile((bloaty *)&local_68,
                     (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                     &local_70);
    pIVar2 = local_68;
    local_68 = (InputFileFactory *)0x0;
    pIVar1 = this->file_factory_;
    this->file_factory_ = pIVar2;
    if (pIVar1 != (InputFileFactory *)0x0) {
      (**(code **)(*(long *)pIVar1 + 8))();
      if (local_68 != (InputFileFactory *)0x0) {
        (**(code **)(*(long *)local_68 + 8))();
      }
      pIVar2 = this->file_factory_;
    }
    if (pIVar2 == (InputFileFactory *)0x0) {
      TryOpenWebAssemblyFile
                ((bloaty *)&local_68,
                 (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)&local_70
                );
      pIVar2 = local_68;
      local_68 = (InputFileFactory *)0x0;
      pIVar1 = this->file_factory_;
      this->file_factory_ = pIVar2;
      if (pIVar1 != (InputFileFactory *)0x0) {
        (**(code **)(*(long *)pIVar1 + 8))();
        if (local_68 != (InputFileFactory *)0x0) {
          (**(code **)(*(long *)local_68 + 8))();
        }
        pIVar2 = this->file_factory_;
      }
      if (pIVar2 == (InputFileFactory *)0x0) {
        TryOpenPEFile((bloaty *)&local_68,
                      (unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *)
                      &local_70);
        pIVar2 = local_68;
        local_68 = (InputFileFactory *)0x0;
        pIVar1 = this->file_factory_;
        this->file_factory_ = pIVar2;
        if (pIVar1 != (InputFileFactory *)0x0) {
          (**(code **)(*(long *)pIVar1 + 8))();
          if (local_68 != (InputFileFactory *)0x0) {
            (**(code **)(*(long *)local_68 + 8))();
          }
          pIVar2 = this->file_factory_;
        }
        if (pIVar2 == (InputFileFactory *)0x0) {
          __s = (char *)*in_RDX;
          if (__s == (char *)0x0) {
            local_68 = (InputFileFactory *)0x0;
          }
          else {
            local_68 = (InputFileFactory *)strlen(__s);
          }
          format._M_str = (char *)&local_68;
          format._M_len = (size_t)"unknown file type for file \'$0\'";
          local_60 = __s;
          absl::Substitute_abi_cxx11_(&local_38,(absl *)0x1f,format,in_R8);
          Throw(local_38._M_dataplus._M_p,0x623);
        }
      }
    }
  }
  if (local_70._M_head_impl != (InputFile *)0x0) {
    (*(local_70._M_head_impl)->_vptr_InputFile[2])();
  }
  return (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>)
         (__uniq_ptr_data<bloaty::ObjectFile,_std::default_delete<bloaty::ObjectFile>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ObjectFile> Bloaty::GetObjectFile(
    const std::string& filename) const {
  std::unique_ptr<InputFile> file(file_factory_.OpenFile(filename));
  auto object_file = TryOpenELFFile(file);

  if (!object_file.get()) {
    object_file = TryOpenMachOFile(file);
  }

  if (!object_file.get()) {
    object_file = TryOpenWebAssemblyFile(file);
  }

  if (!object_file.get()) {
    object_file = TryOpenPEFile(file);
  }

  if (!object_file.get()) {
    THROWF("unknown file type for file '$0'", filename.c_str());
  }

  return object_file;
}